

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O1

void display(GLFWwindow *window)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  
  if ((using_toon) || (using_sketch)) {
    uVar2 = 0x3f800000;
    uVar3 = 0x3f800000;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
  }
  glClearColor(uVar2,uVar3,uVar2,0);
  glClear(0x4000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glPushMatrix();
  glTranslatef(Translation[0],Translation[1],Translation[2]);
  iVar1 = Width_global;
  if (Height_global < Width_global) {
    iVar1 = Height_global;
  }
  drawCircle((float)Width_global * 0.5,(float)Height_global * 0.5,(float)iVar1 * 0.8 * 0.5);
  glPopMatrix();
  glfwSwapBuffers(window);
  return;
}

Assistant:

void display( GLFWwindow* window )
{
    if(!using_toon && !using_sketch) glClearColor( 0.0f, 0.0f, 0.0f, 0.0f );      //clear background screen to black if not using toon/sketch shade
    else glClearColor(1.0f, 1.0f, 1.0f, 0.0f); //clear background to white to see silhouttes of toon shade
    
    glClear(GL_COLOR_BUFFER_BIT);                // clear the color buffer (sets everything to black)
    
    glMatrixMode(GL_MODELVIEW);                  // indicate we are specifying camera transformations
    glLoadIdentity();                            // make sure transformation is "zero'd"
    
    //----------------------- code to draw objects --------------------------
    glPushMatrix();
    glTranslatef (Translation[0], Translation[1], Translation[2]);
    drawCircle(
        Width_global / 2.0 , 
        Height_global / 2.0 , 
        min(Width_global, Height_global) * 0.8 / 2.0);  // present a sphere with max radius possible on screen
    glPopMatrix();
    
    glfwSwapBuffers(window);
    
}